

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_api_v2.c
# Opt level: O0

MPP_RET h264e_proc_prep_cfg(MppEncPrepCfg *dst,MppEncPrepCfg *src)

{
  uint uVar1;
  RockchipSocType RVar2;
  undefined1 local_ac [8];
  MppEncPrepCfg bak;
  RK_S32 rotation;
  RK_S32 mirroring;
  RK_U32 change;
  MPP_RET ret;
  MppEncPrepCfg *src_local;
  MppEncPrepCfg *dst_local;
  
  mirroring = 0;
  uVar1 = src->change;
  if ((uVar1 == 0) &&
     (_mpp_log_l(2,"h264e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"change",
                 "h264e_proc_prep_cfg",0x10a), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if (uVar1 != 0) {
    memcpy(local_ac,dst,0x84);
    if ((uVar1 & 4) != 0) {
      dst->format = src->format;
    }
    if ((uVar1 & 0x10000) != 0) {
      dst->range = src->range;
    }
    if ((uVar1 & 0x20000) != 0) {
      dst->color = src->color;
    }
    if ((uVar1 & 0x40000) != 0) {
      dst->colorprim = src->colorprim;
    }
    if ((uVar1 & 0x80000) != 0) {
      dst->colortrc = src->colortrc;
    }
    if ((uVar1 & 0x10) != 0) {
      dst->rotation_ext = src->rotation_ext;
    }
    if ((uVar1 & 0x20) != 0) {
      dst->mirroring_ext = src->mirroring_ext;
    }
    if ((uVar1 & 0x40) != 0) {
      dst->flip = src->flip;
    }
    if ((uVar1 & 0x100) != 0) {
      dst->denoise = src->denoise;
    }
    if ((uVar1 & 0x200) != 0) {
      memcpy(&dst->sharpen,&src->sharpen,0x24);
    }
    if (((MPP_ENC_ROT_270 < dst->rotation_ext) || (dst->mirroring_ext < 0)) || (dst->flip < 0)) {
      _mpp_log_l(2,"h264e_api_v2","invalid trans: rotation %d, mirroring %d\n",(char *)0x0,
                 (ulong)dst->rotation_ext,(ulong)(uint)dst->mirroring_ext);
      mirroring = -6;
    }
    bak.sharpen.threshold = dst->mirroring_ext;
    bak.sharpen.div = dst->rotation_ext;
    if (dst->flip != 0) {
      bak.sharpen.threshold = (RK_S32)((bak.sharpen.threshold != 0 ^ 0xffU) & 1);
      bak.sharpen.div = bak.sharpen.div + MPP_ENC_ROT_180 & 3;
    }
    dst->mirroring = bak.sharpen.threshold;
    dst->rotation = bak.sharpen.div;
    if (((uVar1 & 1) != 0) || ((uVar1 & 0x10) != 0)) {
      if ((dst->rotation == MPP_ENC_ROT_90) || (dst->rotation == MPP_ENC_ROT_270)) {
        dst->width = src->height;
        dst->height = src->width;
      }
      else {
        dst->width = src->width;
        dst->height = src->height;
      }
      dst->hor_stride = src->hor_stride;
      dst->ver_stride = src->ver_stride;
    }
    dst->change = uVar1 | dst->change;
    if ((dst->rotation == MPP_ENC_ROT_90) || (dst->rotation == MPP_ENC_ROT_270)) {
      if ((dst->hor_stride < dst->height) || (dst->ver_stride < dst->width)) {
        _mpp_log_l(2,"h264e_api_v2","invalid size w:h [%d:%d] stride [%d:%d]\n",(char *)0x0,
                   (ulong)(uint)dst->width,(ulong)(uint)dst->height,dst->hor_stride,dst->ver_stride)
        ;
        mirroring = -6;
      }
    }
    else if ((dst->hor_stride < dst->width) || (dst->ver_stride < dst->height)) {
      _mpp_log_l(2,"h264e_api_v2","invalid size w:h [%d:%d] stride [%d:%d]\n",(char *)0x0,
                 (ulong)(uint)dst->width,(ulong)(uint)dst->height,dst->hor_stride,dst->ver_stride);
      mirroring = -6;
    }
    if (((dst->format & 0xf00000) != MPP_FMT_YUV420SP) &&
       ((((dst->mirroring != 0 || (dst->rotation != MPP_ENC_ROT_0)) || (dst->flip != 0)) &&
        (RVar2 = mpp_get_soc_type(), RVar2 != ROCKCHIP_SOC_RK3588)))) {
      _mpp_log_l(2,"h264e_api_v2",
                 "invalid cfg fbc data no support mirror %d, rotation %d, or flip %d",(char *)0x0,
                 (ulong)(uint)dst->mirroring,(ulong)dst->rotation,dst->flip);
      mirroring = -6;
    }
    if (((MPP_FRAME_RANGE_JPEG < dst->range) || (MPP_FRAME_SPC_ICTCP < dst->color)) ||
       ((MPP_FRAME_PRI_JEDEC_P22 < dst->colorprim || (MPP_FRAME_TRC_ARIB_STD_B67 < dst->colortrc))))
    {
      _mpp_log_l(2,"h264e_api_v2",
                 "invalid color range %d colorspace %d primaries %d transfer characteristic %d\n",
                 (char *)0x0,(ulong)dst->range,(ulong)dst->color,dst->colorprim,dst->colortrc);
      mirroring = -6;
    }
    if (mirroring == 0) {
      _mpp_log_l(4,"h264e_api_v2","MPP_ENC_SET_PREP_CFG w:h [%d:%d] stride [%d:%d]\n",(char *)0x0,
                 (ulong)(uint)dst->width,(ulong)(uint)dst->height,dst->hor_stride,dst->ver_stride);
    }
    else {
      _mpp_log_l(2,"h264e_api_v2","failed to accept new prep config\n","h264e_proc_prep_cfg");
      memcpy(dst,local_ac,0x84);
    }
  }
  src->change = 0;
  return mirroring;
}

Assistant:

static MPP_RET h264e_proc_prep_cfg(MppEncPrepCfg *dst, MppEncPrepCfg *src)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    mpp_assert(change);
    if (change) {
        RK_S32 mirroring;
        RK_S32 rotation;
        MppEncPrepCfg bak = *dst;

        if (change & MPP_ENC_PREP_CFG_CHANGE_FORMAT)
            dst->format = src->format;

        if (change & MPP_ENC_PREP_CFG_CHANGE_COLOR_RANGE)
            dst->range = src->range;

        if (change & MPP_ENC_PREP_CFG_CHANGE_COLOR_SPACE)
            dst->color = src->color;

        if (change & MPP_ENC_PREP_CFG_CHANGE_COLOR_PRIME)
            dst->colorprim = src->colorprim;

        if (change & MPP_ENC_PREP_CFG_CHANGE_COLOR_TRC)
            dst->colortrc = src->colortrc;

        if (change & MPP_ENC_PREP_CFG_CHANGE_ROTATION)
            dst->rotation_ext = src->rotation_ext;

        if (change & MPP_ENC_PREP_CFG_CHANGE_MIRRORING)
            dst->mirroring_ext = src->mirroring_ext;

        if (change & MPP_ENC_PREP_CFG_CHANGE_FLIP)
            dst->flip = src->flip;

        if (change & MPP_ENC_PREP_CFG_CHANGE_DENOISE)
            dst->denoise = src->denoise;

        if (change & MPP_ENC_PREP_CFG_CHANGE_SHARPEN)
            dst->sharpen = src->sharpen;

        // parameter checking
        if (dst->rotation_ext >= MPP_ENC_ROT_BUTT || dst->rotation_ext < 0 ||
            dst->mirroring_ext < 0 || dst->flip < 0) {
            mpp_err("invalid trans: rotation %d, mirroring %d\n", dst->rotation_ext, dst->mirroring_ext);
            ret = MPP_ERR_VALUE;
        }

        /* For unifying the encoder's params used by CFG_SET and CFG_GET command,
         * there is distinction between user's set and set in hal.
         * User can externally set rotation_ext, mirroring_ext and flip,
         * which should be transformed to mirroring and rotation in hal.
         */
        mirroring = dst->mirroring_ext;
        rotation = dst->rotation_ext;

        if (dst->flip) {
            mirroring = !mirroring;
            rotation += MPP_ENC_ROT_180;
            rotation &= MPP_ENC_ROT_270;
        }

        dst->mirroring = mirroring;
        dst->rotation = rotation;

        if ((change & MPP_ENC_PREP_CFG_CHANGE_INPUT) ||
            (change & MPP_ENC_PREP_CFG_CHANGE_ROTATION)) {
            if (dst->rotation == MPP_ENC_ROT_90 || dst->rotation == MPP_ENC_ROT_270) {
                dst->width = src->height;
                dst->height = src->width;
            } else {
                dst->width = src->width;
                dst->height = src->height;
            }
            dst->hor_stride = src->hor_stride;
            dst->ver_stride = src->ver_stride;
        }

        dst->change |= change;

        // parameter checking
        if (dst->rotation == MPP_ENC_ROT_90 || dst->rotation == MPP_ENC_ROT_270) {
            if (dst->height > dst->hor_stride || dst->width > dst->ver_stride) {
                mpp_err("invalid size w:h [%d:%d] stride [%d:%d]\n",
                        dst->width, dst->height, dst->hor_stride, dst->ver_stride);
                ret = MPP_ERR_VALUE;
            }
        } else {
            if (dst->width > dst->hor_stride || dst->height > dst->ver_stride) {
                mpp_err("invalid size w:h [%d:%d] stride [%d:%d]\n",
                        dst->width, dst->height, dst->hor_stride, dst->ver_stride);
                ret = MPP_ERR_VALUE;
            }
        }

        if (MPP_FRAME_FMT_IS_FBC(dst->format) && (dst->mirroring || dst->rotation || dst->flip)) {
            // rk3588 rkvenc support fbc with rotation
            if (mpp_get_soc_type() != ROCKCHIP_SOC_RK3588) {
                mpp_err("invalid cfg fbc data no support mirror %d, rotation %d, or flip %d",
                        dst->mirroring, dst->rotation, dst->flip);
                ret = MPP_ERR_VALUE;
            }
        }

        if (dst->range >= MPP_FRAME_RANGE_NB ||
            dst->color >= MPP_FRAME_SPC_NB ||
            dst->colorprim >= MPP_FRAME_PRI_NB ||
            dst->colortrc >= MPP_FRAME_TRC_NB) {
            mpp_err("invalid color range %d colorspace %d primaries %d transfer characteristic %d\n",
                    dst->range, dst->color, dst->colorprim, dst->colortrc);
            ret = MPP_ERR_VALUE;
        }

        if (ret) {
            mpp_err_f("failed to accept new prep config\n");
            *dst = bak;
        } else {
            mpp_log("MPP_ENC_SET_PREP_CFG w:h [%d:%d] stride [%d:%d]\n",
                    dst->width, dst->height,
                    dst->hor_stride, dst->ver_stride);
        }
    }

    src->change = 0;
    return ret;
}